

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O0

string * __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
::edges_to_string_abi_cxx11_
          (string *__return_storage_ptr__,
          Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>>
          *this)

{
  Edge_handle edge_handle;
  Edge_handle edge_handle_00;
  type_conflict1 tVar1;
  ostream *poVar2;
  Graph_edge *pGVar3;
  Root_vertex_handle local_24c;
  unsigned_long local_248;
  unsigned_long uStack_240;
  unsigned_long local_238;
  Root_vertex_handle local_224;
  undefined1 auStack_220 [8];
  edge_desc_impl<boost::undirected_tag,_unsigned_long> edge;
  Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  __end0;
  Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
  __begin0;
  iterator_range_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_boost::iterators::incrementable_traversal_tag>
  local_1c8;
  iterator_range_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_boost::iterators::incrementable_traversal_tag>
  *local_198;
  Complex_edge_range *__range3;
  ostringstream stream;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
  *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range3);
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
  ::edge_range((Complex_edge_range *)&local_1c8,
               (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                *)this);
  local_198 = &local_1c8;
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_boost::iterators::incrementable_traversal_tag>
  ::begin((Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
           *)&__end0.edge_iterator.second,local_198);
  boost::iterator_range_detail::
  iterator_range_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_boost::iterators::incrementable_traversal_tag>
  ::end((Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>
         *)&edge.m_eproperty,local_198);
  while( true ) {
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::forward_traversal_tag,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                        *)&__end0.edge_iterator.second,
                       (iterator_facade<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::forward_traversal_tag,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                        *)&edge.m_eproperty);
    if (!tVar1) break;
    boost::iterators::detail::
    iterator_facade_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::forward_traversal_tag,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
    ::operator*((reference *)auStack_220,
                (iterator_facade_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::forward_traversal_tag,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
                 *)&__end0.edge_iterator.second);
    poVar2 = std::operator<<((ostream *)&__range3,"{");
    local_238 = edge.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
    local_248 = (unsigned_long)auStack_220;
    uStack_240 = edge.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
    edge_handle.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
         edge.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
    edge_handle.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
         (unsigned_long)auStack_220;
    edge_handle.m_eproperty =
         (property_type *)edge.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
    pGVar3 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
             ::operator[]((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                           *)this,edge_handle);
    local_224 = Skeleton_blocker_simple_traits::Graph_edge::first(pGVar3);
    poVar2 = skeleton_blocker::operator<<(poVar2,&local_224);
    poVar2 = std::operator<<(poVar2,",");
    edge_handle_00.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
         edge.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
    edge_handle_00.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
         (unsigned_long)auStack_220;
    edge_handle_00.m_eproperty =
         (property_type *)edge.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
    pGVar3 = Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
             ::operator[]((Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>
                           *)this,edge_handle_00);
    local_24c = Skeleton_blocker_simple_traits::Graph_edge::second(pGVar3);
    poVar2 = skeleton_blocker::operator<<(poVar2,&local_24c);
    std::operator<<(poVar2,"} ");
    boost::iterators::detail::
    iterator_facade_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::forward_traversal_tag,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
    ::operator++((iterator_facade_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_geometric_traits<Geometry_trait>_>_>,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::forward_traversal_tag,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long,_false,_false>
                  *)&__end0.edge_iterator.second);
  }
  std::ostream::operator<<(&__range3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range3);
  return __return_storage_ptr__;
}

Assistant:

std::string edges_to_string() const {
    std::ostringstream stream;
    for (auto edge : edge_range())
      stream << "{" << (*this)[edge].first() << "," << (*this)[edge].second() << "} ";
    stream << std::endl;
    return stream.str();
  }